

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenCallIndirectSetTable(BinaryenExpressionRef expr,char *table)

{
  undefined1 auStack_20 [8];
  Name name;
  
  wasm::Name::Name((Name *)auStack_20,table);
  if (expr->_id == CallIndirectId) {
    *(undefined1 (*) [8])(expr + 4) = auStack_20;
    expr[4].type.id = name.super_IString.str._M_len;
    return;
  }
  __assert_fail("expression->is<CallIndirect>()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x922,"void BinaryenCallIndirectSetTable(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenCallIndirectSetTable(BinaryenExpressionRef expr,
                                  const char* table) {
  Name name(table);
  auto* expression = (Expression*)expr;

  assert(expression->is<CallIndirect>());
  static_cast<CallIndirect*>(expression)->table = name;
}